

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O0

void am_before_match_do_method_proc(Am_Object *cmd_or_inter)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  void *this;
  Am_Object local_40;
  undefined1 local_38 [8];
  Am_Object_Method do_method;
  Am_Object local_18;
  Am_Object match_command;
  Am_Object *cmd_or_inter_local;
  
  match_command.data = (Am_Object_Data *)cmd_or_inter;
  pAVar2 = Am_Object::Get(cmd_or_inter,Am_INVOKE_MATCH_COMMAND,0);
  Am_Object::Am_Object(&local_18,pAVar2);
  match_and_run(cmd_or_inter,&local_18);
  pAVar2 = Am_Object::Get(cmd_or_inter,Am_REAL_DO_METHOD,0);
  Am_Object_Method::Am_Object_Method((Am_Object_Method *)local_38,pAVar2);
  bVar1 = Am_Object_Method::Valid((Am_Object_Method *)local_38);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"%% Calling ");
    poVar3 = operator<<(poVar3,(Am_Object_Method *)local_38);
    poVar3 = std::operator<<(poVar3," of ");
    poVar3 = operator<<(poVar3,cmd_or_inter);
    this = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
    Am_Object::Am_Object(&local_40,cmd_or_inter);
    (*(code *)do_method.from_wrapper)(&local_40);
    Am_Object::~Am_Object(&local_40);
  }
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_before_match_do_method,
                 (Am_Object cmd_or_inter))
{
  Am_Object match_command = cmd_or_inter.Get(Am_INVOKE_MATCH_COMMAND);
  match_and_run(cmd_or_inter, match_command);
  Am_Object_Method do_method = cmd_or_inter.Get(Am_REAL_DO_METHOD);
  if (do_method.Valid()) {
    std::cout << "%% Calling " << do_method << " of " << cmd_or_inter
              << std::endl
              << std::flush;
    do_method.Call(cmd_or_inter);
  }
}